

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

ptls_hash_context_t * sha512_clone(ptls_hash_context_t *_src)

{
  _func_void_st_ptls_hash_context_t_ptr_void_ptr_ptls_hash_final_mode_t *p_Var1;
  ptls_hash_context_t *ppVar2;
  
  ppVar2 = (ptls_hash_context_t *)malloc(0xf0);
  if (ppVar2 == (ptls_hash_context_t *)0x0) {
    ppVar2 = (ptls_hash_context_t *)0x0;
  }
  else {
    ppVar2->clone_ = _src->clone_;
    p_Var1 = _src->final;
    ppVar2->update = _src->update;
    ppVar2->final = p_Var1;
    memcpy(ppVar2 + 1,_src + 1,0xd8);
  }
  return ppVar2;
}

Assistant:

static int sign_certificate(ptls_sign_certificate_t *_self, ptls_t *tls, ptls_async_job_t **async, uint16_t *selected_algorithm,
                            ptls_buffer_t *outbuf, ptls_iovec_t input, const uint16_t *algorithms, size_t num_algorithms)
{
    ptls_openssl_sign_certificate_t *self = (ptls_openssl_sign_certificate_t *)_self;
    const ptls_openssl_signature_scheme_t *scheme;

    /* Just resume the asynchronous operation, if one is in flight. */
#if PTLS_OPENSSL_HAVE_ASYNC
    if (async != NULL && *async != NULL) {
        struct async_sign_ctx *sign_ctx = (struct async_sign_ctx *)(*async);
        *selected_algorithm = sign_ctx->scheme->scheme_id;
        return do_sign_async(outbuf, async);
    }
#endif

    /* Select the algorithm or return failure if none found. */
    if ((scheme = ptls_openssl_select_signature_scheme(self->schemes, algorithms, num_algorithms)) == NULL)
        return PTLS_ALERT_HANDSHAKE_FAILURE;
    *selected_algorithm = scheme->scheme_id;

#if PTLS_OPENSSL_HAVE_ASYNC
    if (!self->async && async != NULL) {
        /* indicate to `do_sign` that async mode is disabled for this operation */
        assert(*async == NULL);
        async = NULL;
    }
#endif
    return do_sign(self->key, scheme, outbuf, input, async);
}